

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderMultisampleInterpolationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::ShaderMultisampleInterpolationApiCase::iterate(ShaderMultisampleInterpolationApiCase *this)

{
  GLSLVersion GVar1;
  RenderContext *pRVar2;
  bool bVar3;
  GLfloat GVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  TestError *pTVar8;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  allocator<char> local_3e6;
  allocator<char> local_3e5;
  allocator<char> local_3e4;
  allocator<char> local_3e3;
  allocator<char> local_3e2;
  allocator<char> local_3e1;
  allocator<char> local_3e0;
  allocator<char> local_3df;
  allocator<char> local_3de;
  allocator<char> local_3dd;
  allocator<char> local_3dc;
  allocator<char> local_3db;
  allocator<char> local_3da;
  allocator<char> local_3d9;
  TestLog *local_3d8;
  GLint fragmentInterpolationOffsetBits;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  GLfloat minFragmentInterpolationOffset;
  bool local_110;
  GLfloat maxFragmentInterpolationOffset;
  long lVar7;
  
  local_3d8 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar6);
  if ((this->m_glslVersion != GLSL_VERSION_310_ES) ||
     (bVar5 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_shader_multisample_interpolation"), bVar5)) {
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "${VERSION_DECL}\n${OES_SMI_RQ}in highp vec4 a_position;\nin highp vec4 a_color;\nsample out highp vec4 v_color;\nvoid main()\n{\n    gl_Position = a_position;\n}\n"
               ,&local_3d9);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,glcts::fixed_sample_locations_values + 1,&local_3da);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,glcts::fixed_sample_locations_values + 1,&local_3db);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,glcts::fixed_sample_locations_values + 1,&local_3dc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_3dd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_3de);
    specializeVersion(&local_270,&local_290,GVar1,&local_2b0,&local_2d0,&local_2f0,&local_1f0,
                      &local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fragmentInterpolationOffsetBits,local_270._M_dataplus._M_p,&local_3df);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,
               "${VERSION_DECL}\n${OES_SMI_RQ}sample in highp vec4 v_color;\nout highp vec4 o_color;\nvoid main()\n{\n    o_color = v_color;\n}\n"
               ,&local_3e0);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,glcts::fixed_sample_locations_values + 1,&local_3e1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,glcts::fixed_sample_locations_values + 1,&local_3e2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,glcts::fixed_sample_locations_values + 1,&local_3e3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_3e4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,glcts::fixed_sample_locations_values + 1,&local_3e5);
    specializeVersion(&local_330,&local_350,GVar1,&local_370,&local_390,&local_3b0,&local_230,
                      &local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,local_330._M_dataplus._M_p,&local_3e6);
    glu::makeVtxFragSources
              ((ProgramSources *)&maxFragmentInterpolationOffset,
               (string *)&fragmentInterpolationOffsetBits,&local_310);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&minFragmentInterpolationOffset,pRVar2,
               (ProgramSources *)&maxFragmentInterpolationOffset);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&maxFragmentInterpolationOffset);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&fragmentInterpolationOffsetBits);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    glu::operator<<(local_3d8,(ShaderProgram *)&minFragmentInterpolationOffset);
    if (local_110 == false) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderMultisampleInterpolationTests.cpp"
                 ,0xa1);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&minFragmentInterpolationOffset);
    pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "${VERSION_DECL}\n${OES_SMI_RQ}in highp vec4 a_position;\nin highp vec4 a_color;\nsample out highp vec4 v_color;\nvoid main()\n{\n    gl_Position = a_position;\n}\n"
               ,&local_3d9);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,glcts::fixed_sample_locations_values + 1,&local_3da);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,glcts::fixed_sample_locations_values + 1,&local_3db);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,glcts::fixed_sample_locations_values + 1,&local_3dc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,glcts::fixed_sample_locations_values + 1,&local_3dd);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,glcts::fixed_sample_locations_values + 1,&local_3de);
    specializeVersion(&local_270,&local_290,GVar1,&local_2b0,&local_2d0,&local_2f0,&local_1f0,
                      &local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fragmentInterpolationOffsetBits,local_270._M_dataplus._M_p,&local_3df);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,
               "${VERSION_DECL}\n${OES_SMI_EN}sample in highp vec4 v_color;\nout highp vec4 o_color;\nvoid main()\n{\n${OES_SMI_CH}    o_color = v_color;\n}\n"
               ,&local_3e0);
    GVar1 = this->m_glslVersion;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,glcts::fixed_sample_locations_values + 1,&local_3e1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,glcts::fixed_sample_locations_values + 1,&local_3e2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,glcts::fixed_sample_locations_values + 1,&local_3e3);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,glcts::fixed_sample_locations_values + 1,&local_3e4);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,glcts::fixed_sample_locations_values + 1,&local_3e5);
    specializeVersion(&local_330,&local_350,GVar1,&local_370,&local_390,&local_3b0,&local_230,
                      &local_250);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,local_330._M_dataplus._M_p,&local_3e6);
    glu::makeVtxFragSources
              ((ProgramSources *)&maxFragmentInterpolationOffset,
               (string *)&fragmentInterpolationOffsetBits,&local_310);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&minFragmentInterpolationOffset,pRVar2,
               (ProgramSources *)&maxFragmentInterpolationOffset);
    glu::ProgramSources::~ProgramSources((ProgramSources *)&maxFragmentInterpolationOffset);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&fragmentInterpolationOffsetBits);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    glu::operator<<(local_3d8,(ShaderProgram *)&minFragmentInterpolationOffset);
    if (local_110 == false) {
      pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar8,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderMultisampleInterpolationTests.cpp"
                 ,0xb6);
      __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&minFragmentInterpolationOffset);
    minFragmentInterpolationOffset = 0.0;
    (**(code **)(lVar7 + 0x818))(0x8e5b,&minFragmentInterpolationOffset);
    bVar5 = -0.5 < minFragmentInterpolationOffset;
    maxFragmentInterpolationOffset = 0.0;
    (**(code **)(lVar7 + 0x818))(0x8e5c,&maxFragmentInterpolationOffset);
    GVar4 = maxFragmentInterpolationOffset;
    bVar3 = maxFragmentInterpolationOffset < 0.5;
    fragmentInterpolationOffsetBits = 0;
    (**(code **)(lVar7 + 0x868))(0x8e5d,&fragmentInterpolationOffsetBits);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    testResult = (qpTestResult)((fragmentInterpolationOffsetBits < 4 || bVar3) || bVar5);
    description = "Pass";
    if ((fragmentInterpolationOffsetBits < 4 || GVar4 < 0.5) || bVar5) {
      description = "Fail";
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "GL_OES_shader_multisample_interpolation";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

ShaderMultisampleInterpolationApiCase::IterateResult ShaderMultisampleInterpolationApiCase::iterate()
{
	TestLog&			  log  = m_testCtx.getLog();
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	bool				  isOk = true;

	if (m_glslVersion == glu::GLSL_VERSION_310_ES &&
		!m_context.getContextInfo().isExtensionSupported("GL_OES_shader_multisample_interpolation"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_shader_multisample_interpolation");
		return STOP;
	}

	static char const* vss = "${VERSION_DECL}\n"
							 "${OES_SMI_RQ}"
							 "in highp vec4 a_position;\n"
							 "in highp vec4 a_color;\n"
							 "sample out highp vec4 v_color;\n"
							 "void main()\n"
							 "{\n"
							 "    gl_Position = a_position;\n"
							 "}\n";

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SMI_RQ}"
								 "sample in highp vec4 v_color;\n"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "    o_color = v_color;\n"
								 "}\n";

		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
														   specializeVersion(fss, m_glslVersion).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SMI_EN}"
								 "sample in highp vec4 v_color;\n"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "${OES_SMI_CH}"
								 "    o_color = v_color;\n"
								 "}\n";

		glu::ShaderProgram program(m_context.getRenderContext(),
								   glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
														   specializeVersion(fss, m_glslVersion).c_str()));
		log << program;
		if (!program.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	GLfloat minFragmentInterpolationOffset = 0.0f;
	gl.getFloatv(GL_MIN_FRAGMENT_INTERPOLATION_OFFSET, &minFragmentInterpolationOffset);
	if (minFragmentInterpolationOffset > -0.5f)
	{
		isOk = false;
	}

	GLfloat maxFragmentInterpolationOffset = 0.0f;
	gl.getFloatv(GL_MAX_FRAGMENT_INTERPOLATION_OFFSET, &maxFragmentInterpolationOffset);
	if (maxFragmentInterpolationOffset < 0.5f)
	{
		isOk = false;
	}

	GLint fragmentInterpolationOffsetBits = 0;
	gl.getIntegerv(GL_FRAGMENT_INTERPOLATION_OFFSET_BITS, &fragmentInterpolationOffsetBits);
	if (fragmentInterpolationOffsetBits < 4)
	{
		isOk = false;
	}

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, isOk ? "Pass" : "Fail");
	return STOP;
}